

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O1

rfc5444_result
rfc5444_writer_add_addrtlv
          (rfc5444_writer *writer,rfc5444_writer_address *addr,rfc5444_writer_tlvtype *tlvtype,
          void *value,size_t length,_Bool allow_dup)

{
  rfc5444_result rVar1;
  avl_node *paVar2;
  rfc5444_writer_addrtlv *prVar3;
  uint8_t *__dest;
  
  if (writer->_state != RFC5444_WRITER_ADD_ADDRESSES) {
    __assert_fail("writer->_state == RFC5444_WRITER_ADD_ADDRESSES",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0xc4,
                  "enum rfc5444_result rfc5444_writer_add_addrtlv(struct rfc5444_writer *, struct rfc5444_writer_address *, struct rfc5444_writer_tlvtype *, const void *, size_t, _Bool)"
                 );
  }
  if ((!allow_dup) &&
     (paVar2 = avl_find(&addr->_addrtlv_tree,&tlvtype->_full_type), paVar2 != (avl_node *)0x0)) {
    return RFC5444_DUPLICATE_TLV;
  }
  prVar3 = (*writer->malloc_addrtlv_entry)();
  if (prVar3 == (rfc5444_writer_addrtlv *)0x0) {
    rVar1 = RFC5444_OUT_OF_MEMORY;
  }
  else {
    prVar3->address = addr;
    prVar3->tlvtype = tlvtype;
    prVar3->length = (uint16_t)length;
    if (length != 0) {
      if (writer->addrtlv_size < length + writer->_addrtlv_used) {
        __dest = (uint8_t *)0x0;
      }
      else {
        __dest = writer->addrtlv_buffer + writer->_addrtlv_used;
        memcpy(__dest,value,length);
        writer->_addrtlv_used = writer->_addrtlv_used + length;
      }
      prVar3->value = __dest;
      if (__dest == (uint8_t *)0x0) {
        (*writer->free_addrtlv_entry)(prVar3);
        return RFC5444_OUT_OF_ADDRTLV_MEM;
      }
    }
    (prVar3->addrtlv_node).key = &tlvtype->_full_type;
    avl_insert(&addr->_addrtlv_tree,&prVar3->addrtlv_node);
    rVar1 = RFC5444_OKAY;
  }
  return rVar1;
}

Assistant:

enum rfc5444_result
rfc5444_writer_add_addrtlv(struct rfc5444_writer *writer, struct rfc5444_writer_address *addr,
  struct rfc5444_writer_tlvtype *tlvtype, const void *value, size_t length, bool allow_dup)
{
  struct rfc5444_writer_addrtlv *addrtlv;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_ADD_ADDRESSES);
#endif

  /* check for collision if necessary */
  if (!allow_dup && avl_find(&addr->_addrtlv_tree, &tlvtype->_full_type) != NULL) {
    return RFC5444_DUPLICATE_TLV;
  }

  if ((addrtlv = writer->malloc_addrtlv_entry()) == NULL) {
    /* out of memory error */
    return RFC5444_OUT_OF_MEMORY;
  }

  /* set back pointer */
  addrtlv->address = addr;
  addrtlv->tlvtype = tlvtype;

  /* copy value(length) */
  addrtlv->length = length;
  if (length > 0 && (addrtlv->value = _copy_addrtlv_value(writer, value, length)) == NULL) {
    writer->free_addrtlv_entry(addrtlv);
    return RFC5444_OUT_OF_ADDRTLV_MEM;
  }

  /* add to address tree */
  addrtlv->addrtlv_node.key = &tlvtype->_full_type;
  avl_insert(&addr->_addrtlv_tree, &addrtlv->addrtlv_node);

  return RFC5444_OKAY;
}